

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::tuple<char_const&,char_const&>,std::tuple<char,char>>
          (String *__return_storage_ptr__,detail *this,tuple<const_char_&,_const_char_&> *lhs,
          char *op,tuple<char,_char> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  tuple<char,_char> *local_28;
  tuple<char,_char> *rhs_local;
  char *op_local;
  tuple<const_char_&,_const_char_&> *lhs_local;
  
  local_28 = (tuple<char,_char> *)op;
  rhs_local = (tuple<char,_char> *)lhs;
  op_local = (char *)this;
  lhs_local = (tuple<const_char_&,_const_char_&> *)__return_storage_ptr__;
  toString<std::tuple<const_char_&,_const_char_&>,_true>
            (&local_58,(tuple<const_char_&,_const_char_&> *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<std::tuple<char,_char>,_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }